

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38795d::BuildFileImpl::error(BuildFileImpl *this,StringRef message)

{
  SMLoc in_RCX;
  SMLoc in_R8;
  SMRange at;
  
  at.End.Ptr = in_R8.Ptr;
  at.Start.Ptr = in_RCX.Ptr;
  error(this,(StringRef)ZEXT816(0),at,message);
  return;
}

Assistant:

void error(StringRef message) {
    error(mainFilename, {}, message);
  }